

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O1

void stream_write_callback(pa_stream *s,size_t nbytes,void *u)

{
  cubeb_log_level cVar1;
  cubeb_log_callback p_Var2;
  
  cVar1 = cubeb_log_get_level();
  if (CUBEB_LOG_NORMAL < cVar1) {
    p_Var2 = cubeb_log_get_callback();
    if (p_Var2 != (cubeb_log_callback)0x0) {
      cubeb_log_internal("cubeb_pulse.c",0x160,"Output callback to be written buffer size %zd",
                         nbytes);
    }
  }
  if (((*(int *)((long)u + 0x50) == 0) && (*(int *)((long)u + 0x58) == 0)) &&
     (*(long *)((long)u + 0x18) == 0)) {
    if (*(long *)((long)u + 0x10) != 0) {
      trigger_user_callback(s,(void *)0x0,nbytes,(cubeb_stream_conflict *)u);
      return;
    }
    __assert_fail("!stm->input_stream && stm->output_stream",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                  ,0x169,"void stream_write_callback(pa_stream *, size_t, void *)");
  }
  return;
}

Assistant:

static void
stream_write_callback(pa_stream * s, size_t nbytes, void * u)
{
  LOGV("Output callback to be written buffer size %zd", nbytes);
  cubeb_stream * stm = u;
  if (stm->shutdown || stm->state != CUBEB_STATE_STARTED) {
    return;
  }

  if (!stm->input_stream) {
    // Output/playback only operation.
    // Write directly to output
    assert(!stm->input_stream && stm->output_stream);
    trigger_user_callback(s, NULL, nbytes, stm);
  }
}